

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,Gui *gui)

{
  Vector2f local_30;
  
  Style::Style(&this->super_Style,gui);
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__TextBoxStyle_0027ca90;
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->box_,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->caret_,&local_30);
  sf::Text::Text(&this->text_);
  sf::Color::Color(&this->boxColor_);
  sf::Color::Color(&this->readOnlyBoxColor_);
  sf::Color::Color(&this->textColor_);
  sf::Color::Color(&this->defaultTextColor_);
  (this->textPadding_).x = 0.0;
  (this->textPadding_).y = 0.0;
  (this->textPadding_).z = 0.0;
  return;
}

Assistant:

TextBoxStyle::TextBoxStyle(const Gui& gui) :
    Style(gui) {
}